

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

void __thiscall google::anon_unknown_1::FlagRegistry::Lock(FlagRegistry *this)

{
  FlagRegistry *this_local;
  
  gflags_mutex_namespace::Mutex::Lock(&this->lock_);
  return;
}

Assistant:

void Lock() { lock_.Lock(); }